

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CIBuildOnlyReporter.cpp
# Opt level: O2

bool __thiscall
ApprovalTests::CIBuildOnlyReporter::report
          (CIBuildOnlyReporter *this,string *received,string *approved)

{
  element_type *peVar1;
  bool bVar2;
  string local_60 [32];
  string local_40 [32];
  
  bVar2 = isRunningUnderCI();
  if (bVar2) {
    peVar1 = (this->m_reporter).
             super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    ::std::__cxx11::string::string(local_40,(string *)received);
    ::std::__cxx11::string::string(local_60,(string *)approved);
    (*peVar1->_vptr_Reporter[2])(peVar1,local_40,local_60);
    ::std::__cxx11::string::~string(local_60);
    ::std::__cxx11::string::~string(local_40);
  }
  return bVar2;
}

Assistant:

bool CIBuildOnlyReporter::report(std::string received, std::string approved) const
    {
        if (!isRunningUnderCI())
        {
            return false;
        }
        m_reporter->report(received, approved);
        // Return true regardless of whether our report succeeded or not,
        // so that no later reporters run.
        return true;
    }